

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall IMLE::validForwardSolutions(IMLE *this,int *newSol1,int *newSol2,int *worseSol)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  pointer pMVar5;
  long lVar6;
  pointer piVar7;
  pointer pFVar8;
  bool bVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  undefined8 *puVar15;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
  *val;
  ulong uVar16;
  long lVar17;
  char *pmessage;
  int *piVar18;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  Index othersize;
  long lVar19;
  long lVar20;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar21;
  double dVar22;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar23;
  X diffX;
  Vec T;
  Vec sumWsq;
  scalar_sum_op<double,_double> local_161;
  Mat *local_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  int *local_148;
  void *local_140;
  longdouble local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  longdouble local_100;
  int *local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
  local_e8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
  local_98;
  int *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  local_158.m_storage.m_data = (double *)0x0;
  local_158.m_storage.m_rows = 0;
  local_f0 = newSol1;
  local_68 = newSol2;
  if ((long)this->M < 1) {
    local_140 = (void *)0x0;
  }
  else {
    local_140 = malloc((long)this->M << 3);
    if (local_140 == (void *)0x0) {
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = operator_delete;
      __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  lVar19 = (long)this->nSolFound;
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar19,1);
  if (local_128.m_storage.m_rows != lVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar19,1);
  }
  if (0 < local_128.m_storage.m_rows) {
    memset(local_128.m_storage.m_data,0,local_128.m_storage.m_rows << 3);
  }
  lVar19 = (long)this->nSolFound;
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  local_148 = worseSol;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar19,1);
  if (local_118.m_storage.m_rows != lVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,lVar19,1);
  }
  if (0 < local_118.m_storage.m_rows) {
    memset(local_118.m_storage.m_data,0,local_118.m_storage.m_rows << 3);
  }
  if (0 < this->M) {
    local_160 = &this->fInvRj;
    lVar19 = 0;
    do {
      iVar4 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar19];
      pMVar5 = (this->predictions).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = *(long *)&(this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar19].super_LinearExpert.pred_x
                         .super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
      lVar6 = (long)pMVar5[iVar4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
      uVar16 = pMVar5[iVar4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (local_158.m_storage.m_rows != uVar16) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_158,uVar16,1)
        ;
      }
      uVar16 = local_158.m_storage.m_rows - (local_158.m_storage.m_rows >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_158.m_storage.m_rows) {
        lVar17 = 0;
        do {
          pdVar1 = (double *)(lVar20 + lVar17 * 8);
          dVar22 = pdVar1[1];
          pdVar2 = (double *)(lVar6 + lVar17 * 8);
          dVar3 = pdVar2[1];
          local_158.m_storage.m_data[lVar17] = *pdVar1 - *pdVar2;
          (local_158.m_storage.m_data + lVar17)[1] = dVar22 - dVar3;
          lVar17 = lVar17 + 2;
        } while (lVar17 < (long)uVar16);
      }
      if ((long)uVar16 < local_158.m_storage.m_rows) {
        do {
          local_158.m_storage.m_data[uVar16] =
               *(double *)(lVar20 + uVar16 * 8) - *(double *)(lVar6 + uVar16 * 8);
          uVar16 = uVar16 + 1;
        } while (local_158.m_storage.m_rows != uVar16);
      }
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_e8.m_rhs.m_lhs.m_diagonal.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value * lVar19;
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           local_160;
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_e8.m_lhs = (LhsNested)&local_158;
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = lVar19;
      local_e8.m_rhs.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_e8.m_rhs.m_lhs.m_diagonal.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      local_e8.m_rhs.m_rhs = (RhsNested)&local_158;
      if (local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value == 0) {
        dVar22 = 0.0;
      }
      else {
        local_98.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_158.m_storage.m_data;
        local_98.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
        .
        super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
        .
        super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
        .m_diagImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             (local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_rows;
        local_98.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
        .
        super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
        .
        super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
        .m_matImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .m_d.data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                    (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                    local_158.m_storage.m_data;
        local_98.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
        .
        super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
        .
        super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
        .m_diagImpl.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = local_e8.m_rhs.m_lhs.m_diagonal.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
        dVar22 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>,Eigen::Matrix<double,-1,1,0,-1,1>,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>const>>
                           (&local_98,&local_161,&local_e8);
      }
      *(double *)((long)local_140 + lVar19 * 8) = dVar22;
      iVar4 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar19];
      local_128.m_storage.m_data[iVar4] = dVar22 + local_128.m_storage.m_data[iVar4];
      dVar22 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19].super_LinearExpert.p_z_T;
      local_118.m_storage.m_data[iVar4] = dVar22 * dVar22 + local_118.m_storage.m_data[iVar4];
      lVar19 = lVar19 + 1;
    } while (lVar19 < this->M);
  }
  *local_148 = -1;
  if (this->nSolFound < 1) {
    local_160 = (Mat *)0xbff0000000000000;
  }
  else {
    lVar19 = 0;
    local_100 = (longdouble)1.79769313486232e+308;
    lVar20 = 0;
    local_160 = (Mat *)0xbff0000000000000;
    do {
      dVar22 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar20];
      pPVar23 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                ((double)this->D * ((dVar22 * dVar22) / local_118.m_storage.m_data[lVar20] + -1.0) +
                1.0);
      if ((1.0 <= (double)pPVar23) && (0.0 < local_128.m_storage.m_data[lVar20])) {
        local_98.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = pPVar23;
        if (0x3fe < (uint)((ulong)((long)ABS((double)pPVar23) + -0x10000000000000) >> 0x35) ||
            (long)pPVar23 < 0) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",(double *)&local_98);
        }
        local_e8.m_lhs =
             (LhsNested)
             local_98.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d._0_8_;
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        val = &local_e8;
        if ((undefined1 *)
            ((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     (local_98.
                      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                      .
                      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                      .m_d._0_8_ + -0x10))->m_storage).m_rows + 7) < (undefined1 *)0xfffffffffffff
            || -1 < (long)local_98.
                          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                          .
                          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                          .m_d._0_8_ &&
               (uint)((local_98.
                       super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                       .
                       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                       .m_d._0_8_ & 0x7fffffffffffffff) + 0xfff0000000000000 >> 0x35) < 0x3ff) {
          dVar22 = *(double *)((long)local_128.m_storage.m_data + lVar19);
          if ((0x3fe < (uint)((ulong)((long)ABS(dVar22) + -0x10000000000000) >> 0x35) ||
              (long)dVar22 < 0) && (ABS(dVar22) != 0.0 && 0xffffffffffffe < (long)dVar22 - 1U)) {
            val = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                   *)((long)local_128.m_storage.m_data + lVar19);
            pmessage = "Chi Square parameter was %1%, but must be > 0 !";
            goto LAB_0014aa33;
          }
          local_48 = (double)local_98.
                             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
                             .
                             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                             .m_d._0_8_ * 0.5;
          local_50 = dVar22 * 0.5;
          boost::math::detail::
          gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x1,(detail *)0x0,(longdouble)local_48,(longdouble)local_50,
                     SUB81(&local_161,0),false,in_R8,in_R9);
          local_3c = ABS(in_ST0);
          dVar22 = 0.0;
          lVar10 = in_ST1;
          lVar11 = in_ST2;
          lVar12 = in_ST3;
          lVar13 = in_ST4;
          lVar14 = in_ST5;
          local_138 = in_ST0;
          if (local_100 < local_3c) {
            lVar21 = in_ST5;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            dVar22 = (double)local_138;
            lVar10 = in_ST1;
            lVar11 = in_ST2;
            lVar12 = in_ST3;
            lVar13 = in_ST4;
            lVar14 = in_ST5;
            in_ST5 = lVar21;
            local_58 = dVar22;
          }
          in_ST4 = lVar14;
          in_ST3 = lVar13;
          in_ST2 = lVar12;
          in_ST1 = lVar11;
          in_ST0 = lVar10;
          local_60 = (double)local_138;
          if (local_3c <= local_100) {
            dVar22 = local_60;
          }
        }
        else {
LAB_0014aa33:
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    (boost::math::
                     cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                     ::function,pmessage,(double *)val);
          dVar22 = NAN;
        }
        if ((double)local_160 <= dVar22) {
          *local_148 = (int)lVar20;
          local_160 = (Mat *)dVar22;
        }
      }
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 8;
    } while (lVar20 < this->nSolFound);
  }
  dVar22 = (this->param).multiValuedSignificance;
  local_100 = (longdouble)CONCAT28(local_100._8_2_,dVar22);
  if (dVar22 < (double)local_160) {
    if (0 < this->M) {
      piVar7 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar22 = -1.0;
      lVar19 = 0;
      do {
        if ((piVar7[lVar19] == *local_148) &&
           (dVar3 = *(double *)((long)local_140 + lVar19 * 8), dVar22 < dVar3)) {
          *local_f0 = (int)lVar19;
          dVar22 = dVar3;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < this->M);
    }
    if (0 < this->M) {
      local_138 = (longdouble)CONCAT28(local_138._8_2_,0xbff0000000000000);
      lVar19 = 0;
      piVar18 = local_148;
      do {
        if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar19] == *piVar18) {
          pFVar8 = (this->experts).
                   super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   .
                   super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)&pFVar8[lVar19].super_LinearExpert.pred_x.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          lVar6 = *(long *)&pFVar8[*local_f0].super_LinearExpert.pred_x.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          uVar16 = pFVar8[*local_f0].super_LinearExpert.pred_x.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (local_158.m_storage.m_rows != uVar16) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_158,uVar16,1);
          }
          uVar16 = local_158.m_storage.m_rows - (local_158.m_storage.m_rows >> 0x3f) &
                   0xfffffffffffffffe;
          if (1 < local_158.m_storage.m_rows) {
            lVar17 = 0;
            do {
              pdVar1 = (double *)(lVar20 + lVar17 * 8);
              dVar22 = pdVar1[1];
              pdVar2 = (double *)(lVar6 + lVar17 * 8);
              dVar3 = pdVar2[1];
              local_158.m_storage.m_data[lVar17] = *pdVar1 - *pdVar2;
              (local_158.m_storage.m_data + lVar17)[1] = dVar22 - dVar3;
              lVar17 = lVar17 + 2;
            } while (lVar17 < (long)uVar16);
          }
          if ((long)uVar16 < local_158.m_storage.m_rows) {
            do {
              local_158.m_storage.m_data[uVar16] =
                   *(double *)(lVar20 + uVar16 * 8) - *(double *)(lVar6 + uVar16 * 8);
              uVar16 = uVar16 + 1;
            } while (local_158.m_storage.m_rows != uVar16);
          }
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value =
               (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
                   local_e8.m_rhs.m_lhs.m_diagonal.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                   .m_rows.m_value * lVar19;
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startRow.m_value = 0;
          local_e8.m_lhs = (LhsNested)&local_158;
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
               &this->fInvRj;
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startCol.m_value = lVar19;
          local_e8.m_rhs.m_lhs.m_diagonal.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_outerStride =
               local_e8.m_rhs.m_lhs.m_diagonal.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_rows.m_value;
          local_e8.m_rhs.m_rhs = (RhsNested)&local_158;
          if (local_e8.m_rhs.m_lhs.m_diagonal.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
              m_rows.m_value == 0) {
            dVar22 = 0.0;
          }
          else {
            local_98.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_158.m_storage.m_data;
            local_98.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
            .
            super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
            .
            super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
            .m_diagImpl.
            super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_outerStride.m_value =
                 (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
            local_98.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
            .
            super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
            .
            super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
            .m_matImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                   (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                   local_158.m_storage.m_data;
            local_98.
            super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>_>
            .
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
            .m_d.rhsImpl.
            super_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
            .
            super_product_evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_7,_Eigen::DiagonalShape,_Eigen::DenseShape,_double,_double>
            .
            super_diagonal_product_evaluator_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>,_1>
            .m_diagImpl.
            super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            .m_data = local_e8.m_rhs.m_lhs.m_diagonal.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      .m_data;
            dVar22 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>,Eigen::Matrix<double,-1,1,0,-1,1>,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>const>>
                               (&local_98,&local_161,&local_e8);
          }
          piVar18 = local_148;
          if (local_138._0_8_ < dVar22) {
            *local_68 = (int)lVar19;
            local_138 = (longdouble)CONCAT28(local_138._8_2_,dVar22);
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < this->M);
    }
  }
  bVar9 = (double)local_160 <= local_100._0_8_;
  free(local_118.m_storage.m_data);
  free(local_128.m_storage.m_data);
  free(local_140);
  free(local_158.m_storage.m_data);
  return bVar9;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}